

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDefaultSoftBodySolver.cpp
# Opt level: O0

void __thiscall btDefaultSoftBodySolver::updateSoftBodies(btDefaultSoftBodySolver *this)

{
  bool bVar1;
  int iVar2;
  btCollisionObject *in_RDI;
  btSoftBody *psb;
  int i;
  int local_c;
  
  for (local_c = 0;
      iVar2 = btAlignedObjectArray<btSoftBody_*>::size
                        ((btAlignedObjectArray<btSoftBody_*> *)
                         ((in_RDI->m_worldTransform).m_basis.m_el + 1)), local_c < iVar2;
      local_c = local_c + 1) {
    btAlignedObjectArray<btSoftBody_*>::operator[]
              ((btAlignedObjectArray<btSoftBody_*> *)((in_RDI->m_worldTransform).m_basis.m_el + 1),
               local_c);
    bVar1 = btCollisionObject::isActive(in_RDI);
    if (bVar1) {
      btSoftBody::integrateMotion((btSoftBody *)0x29911f);
    }
  }
  return;
}

Assistant:

void btDefaultSoftBodySolver::updateSoftBodies( )
{
	for ( int i=0; i < m_softBodySet.size(); i++)
	{
		btSoftBody*	psb=(btSoftBody*)m_softBodySet[i];
		if (psb->isActive())
		{
			psb->integrateMotion();	
		}
	}
}